

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall
spvtools::val::ValidationState_t::GetStructMemberTypes
          (ValidationState_t *this,uint32_t struct_type_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *member_types)

{
  bool bVar1;
  Op OVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  allocator<unsigned_int> local_61;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  Instruction *local_30;
  Instruction *inst;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *member_types_local;
  ValidationState_t *pVStack_18;
  uint32_t struct_type_id_local;
  ValidationState_t *this_local;
  
  inst = (Instruction *)member_types;
  member_types_local._4_4_ = struct_type_id;
  pVStack_18 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(member_types);
  if (member_types_local._4_4_ == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_30 = FindDef(this,member_types_local._4_4_);
    if (local_30 == (Instruction *)0x0) {
      __assert_fail("inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x498,
                    "bool spvtools::val::ValidationState_t::GetStructMemberTypes(uint32_t, std::vector<uint32_t> *) const"
                   );
    }
    OVar2 = Instruction::opcode(local_30);
    if (OVar2 == OpTypeStruct) {
      pvVar3 = Instruction::words(local_30);
      local_58._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cbegin(pvVar3);
      local_50 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator+(&local_58,2);
      pvVar3 = Instruction::words(local_30);
      local_60._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cend(pvVar3);
      std::allocator<unsigned_int>::allocator(&local_61);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,local_50,local_60,
                 &local_61);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&inst->words_,&local_48);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_48);
      std::allocator<unsigned_int>::~allocator(&local_61);
      bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&inst->words_);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ValidationState_t::GetStructMemberTypes(
    uint32_t struct_type_id, std::vector<uint32_t>* member_types) const {
  member_types->clear();
  if (!struct_type_id) return false;

  const Instruction* inst = FindDef(struct_type_id);
  assert(inst);
  if (inst->opcode() != spv::Op::OpTypeStruct) return false;

  *member_types =
      std::vector<uint32_t>(inst->words().cbegin() + 2, inst->words().cend());

  if (member_types->empty()) return false;

  return true;
}